

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.h
# Opt level: O0

bool __thiscall wasm::Literal::isNegative(Literal *this)

{
  BasicType BVar1;
  Literal *this_local;
  
  BVar1 = wasm::Type::getBasic(&this->type);
  switch(BVar1) {
  case i32:
  case f32:
    this_local._7_1_ = (this->field_0).i32 < 0;
    break;
  case i64:
  case f64:
    this_local._7_1_ = (this->field_0).i64 < 0;
    break;
  default:
    handle_unreachable("unexpected type",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
                       ,0x8b);
  }
  return this_local._7_1_;
}

Assistant:

bool isNegative() const {
    switch (type.getBasic()) {
      case Type::i32:
      case Type::f32:
        return i32 < 0;
      case Type::i64:
      case Type::f64:
        return i64 < 0;
      default:
        WASM_UNREACHABLE("unexpected type");
    }
  }